

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPCDecoder.cpp
# Opt level: O2

IPCObject * __thiscall
gnilk::IPCBinaryDecoder::ReadObject(IPCBinaryDecoder *this,uint8_t expectedMsgId)

{
  int iVar1;
  IPCObject *pIVar2;
  IPCObject *pIVar3;
  IPCMsgHeader header;
  undefined4 extraout_var;
  
  header.msgHeaderVersion = '\x01';
  header.msgId = '\0';
  header.reserved = 0;
  header.msgSize = 0;
  iVar1 = (**(this->super_IPCDecoderBase).super_IPCReader._vptr_IPCReader)(this,&header,8);
  pIVar3 = (IPCObject *)0x0;
  if ((-1 < iVar1) && (header.msgId == expectedMsgId)) {
    iVar1 = (*(this->deserializer->super_IPCObject)._vptr_IPCObject[2])
                      (this->deserializer,(ulong)expectedMsgId);
    pIVar2 = (IPCObject *)CONCAT44(extraout_var,iVar1);
    iVar1 = (*pIVar2->_vptr_IPCObject[3])(pIVar2,this);
    pIVar3 = (IPCObject *)0x0;
    if ((char)iVar1 != '\0') {
      pIVar3 = pIVar2;
    }
  }
  return pIVar3;
}

Assistant:

IPCObject *IPCBinaryDecoder::ReadObject(uint8_t expectedMsgId) {
    IPCMsgHeader header;
    if (Read(&header, sizeof(header)) < 0) {
        return nullptr;
    }
    if (header.msgId != expectedMsgId) {
        return nullptr;
    }
    auto handler = deserializer.GetDeserializerForObject(header.msgId);
    if (!handler->Unmarshal(*this)) {
        return nullptr;
    }
    return handler;
}